

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O1

void __thiscall test_suite::detail::simple_runner::note(simple_runner *this,char *msg)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = this->log_;
  if (msg == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,msg,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void
  note(char const* msg) override
  {
    log_ << msg << "\n";
  }